

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

TypeFunction *
GetGenericFunctionInstanceType
          (ExpressionContext *ctx,SynBase *source,TypeBase *parentType,FunctionData *function,
          ArrayView<CallArgumentData> arguments,IntrusiveList<MatchData> *aliases)

{
  SynIdentifier *name;
  IntrusiveList<MatchData> aliases_00;
  IntrusiveList<TypeHandle> arguments_00;
  IntrusiveList<TypeHandle> arguments_01;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  TypeHandle *pTVar5;
  CallArgumentData *pCVar6;
  MatchData *this;
  GenericFunctionInstanceTypeResponse *pGVar7;
  VariableData *this_00;
  TypeBase *local_308;
  GenericFunctionInstanceTypeResponse local_2d8;
  TypeHandle *local_2c0;
  TypeHandle *local_2b8;
  TypeFunction *local_2b0;
  TypeFunction *typeFunction;
  MatchData *local_2a0;
  GenericFunctionInstanceTypeResponse local_298;
  MatchData *local_280;
  MatchData *alias;
  MatchData *pMStack_270;
  bool matched;
  MatchData *curr_1;
  MatchData *local_260;
  GenericFunctionInstanceTypeResponse local_258;
  MatchData *local_240;
  MatchData *local_238;
  GenericFunctionInstanceTypeResponse local_230;
  TypeBase *local_218;
  TypeBase *type_1;
  CallArgumentData *actualArgument_1;
  ArgumentData *funtionArgument;
  TypeBase *pTStack_1f8;
  uint i_1;
  TypeBase *type;
  CallArgumentData *actualArgument;
  TypeBase *expectedType;
  SynFunctionArgument *pSStack_1d8;
  bool failed;
  SynFunctionArgument *argument;
  uint pos;
  bool addedParentScope;
  SynFunctionDefinition *syntax;
  uint traceDepth;
  bool prevErrorHandlerNested;
  jmp_buf prevErrorHandler;
  undefined1 local_e8 [8];
  IntrusiveList<TypeHandle> types;
  ScopeData *scope;
  GenericFunctionInstanceTypeResponse *response;
  undefined1 local_a8 [8];
  GenericFunctionInstanceTypeRequest request;
  MatchData *curr;
  undefined1 auStack_60 [4];
  uint i;
  IntrusiveList<MatchData> incomingAliases;
  IntrusiveList<TypeHandle> incomingArguments;
  FunctionData *function_local;
  TypeBase *parentType_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  ArrayView<CallArgumentData> arguments_local;
  
  ctx_local = (ExpressionContext *)arguments.data;
  arguments_local.data._0_4_ = arguments.count;
  uVar2 = SmallArray<ArgumentData,_4U>::size(&function->arguments);
  uVar3 = ArrayView<CallArgumentData>::size((ArrayView<CallArgumentData> *)&ctx_local);
  if (uVar2 != uVar3) {
    __assert_fail("function->arguments.size() == arguments.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x188b,
                  "TypeFunction *GetGenericFunctionInstanceType(ExpressionContext &, SynBase *, TypeBase *, FunctionData *, ArrayView<CallArgumentData>, IntrusiveList<MatchData> &)"
                 );
  }
  IntrusiveList<TypeHandle>::IntrusiveList((IntrusiveList<TypeHandle> *)&incomingAliases.tail);
  IntrusiveList<MatchData>::IntrusiveList((IntrusiveList<MatchData> *)auStack_60);
  for (curr._4_4_ = 0;
      uVar2 = ArrayView<CallArgumentData>::size((ArrayView<CallArgumentData> *)&ctx_local),
      curr._4_4_ < uVar2; curr._4_4_ = curr._4_4_ + 1) {
    pTVar5 = ExpressionContext::get<TypeHandle>(ctx);
    pCVar6 = ArrayView<CallArgumentData>::operator[]
                       ((ArrayView<CallArgumentData> *)&ctx_local,curr._4_4_);
    TypeHandle::TypeHandle(pTVar5,pCVar6->type);
    IntrusiveList<TypeHandle>::push_back((IntrusiveList<TypeHandle> *)&incomingAliases.tail,pTVar5);
  }
  for (request.aliases.tail = aliases->head; request.aliases.tail != (MatchData *)0x0;
      request.aliases.tail = (request.aliases.tail)->next) {
    this = ExpressionContext::get<MatchData>(ctx);
    MatchData::MatchData(this,(request.aliases.tail)->name,(request.aliases.tail)->type);
    IntrusiveList<MatchData>::push_back((IntrusiveList<MatchData> *)auStack_60,this);
  }
  arguments_01.tail = incomingArguments.head;
  arguments_01.head = (TypeHandle *)incomingAliases.tail;
  aliases_00.tail._0_4_ = (int)incomingAliases.head;
  aliases_00.head = _auStack_60;
  aliases_00.tail._4_4_ = (int)((ulong)incomingAliases.head >> 0x20);
  GenericFunctionInstanceTypeRequest::GenericFunctionInstanceTypeRequest
            ((GenericFunctionInstanceTypeRequest *)local_a8,parentType,function,arguments_01,
             aliases_00);
  pGVar7 = SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
           ::find(&ctx->genericFunctionInstanceTypeMap,
                  (GenericFunctionInstanceTypeRequest *)local_a8);
  if (pGVar7 == (GenericFunctionInstanceTypeResponse *)0x0) {
    types.tail = (TypeHandle *)ctx->scope;
    ExpressionContext::SwitchToScopeAtPoint(ctx,function->scope,function->source);
    IntrusiveList<TypeHandle>::IntrusiveList((IntrusiveList<TypeHandle> *)local_e8);
    memcpy(&traceDepth,ctx->errorHandler,200);
    syntax._7_1_ = ctx->errorHandlerNested & 1;
    ctx->errorHandlerNested = true;
    syntax._0_4_ = NULLC::TraceGetDepth();
    iVar4 = _setjmp((__jmp_buf_tag *)ctx->errorHandler);
    if (iVar4 != 0) {
      NULLC::TraceLeaveTo((uint)syntax);
      ExpressionContext::SwitchToScopeAtPoint(ctx,(ScopeData *)types.tail,(SynBase *)0x0);
      memcpy(ctx->errorHandler,&traceDepth,200);
      ctx->errorHandlerNested = (bool)(syntax._7_1_ & 1);
      longjmp((__jmp_buf_tag *)ctx->errorHandler,1);
    }
    _pos = GetGenericFunctionDefinition(ctx,source,function);
    if (_pos == (SynFunctionDefinition *)0x0) {
      if (function->importModule != (ModuleData *)0x0) {
        anon_unknown.dwarf_8df1c::Stop
                  (ctx,source,"ERROR: imported generic function call is not supported");
      }
      for (funtionArgument._4_4_ = 0; uVar2 = funtionArgument._4_4_,
          uVar3 = SmallArray<ArgumentData,_4U>::size(&function->arguments), uVar2 < uVar3;
          funtionArgument._4_4_ = funtionArgument._4_4_ + 1) {
        actualArgument_1 =
             (CallArgumentData *)
             SmallArray<ArgumentData,_4U>::operator[](&function->arguments,funtionArgument._4_4_);
        type_1 = (TypeBase *)
                 ArrayView<CallArgumentData>::operator[]
                           ((ArrayView<CallArgumentData> *)&ctx_local,funtionArgument._4_4_);
        local_218 = MatchArgumentType(ctx,(SynBase *)actualArgument_1->type,
                                      (TypeBase *)actualArgument_1[1].value,
                                      (TypeBase *)type_1->_vptr_TypeBase,
                                      *(ExprBase **)&type_1->typeID,aliases);
        if ((local_218 == (TypeBase *)0x0) || (bVar1 = isType<TypeError>(local_218), bVar1)) {
          local_240 = aliases->head;
          local_238 = aliases->tail;
          GenericFunctionInstanceTypeResponse::GenericFunctionInstanceTypeResponse
                    (&local_230,(TypeFunction *)0x0,*aliases);
          SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
          ::insert(&ctx->genericFunctionInstanceTypeMap,
                   (GenericFunctionInstanceTypeRequest *)local_a8,&local_230);
          return (TypeFunction *)0x0;
        }
        pTVar5 = ExpressionContext::get<TypeHandle>(ctx);
        TypeHandle::TypeHandle(pTVar5,local_218);
        IntrusiveList<TypeHandle>::push_back((IntrusiveList<TypeHandle> *)local_e8,pTVar5);
      }
    }
    else {
      argument._7_1_ = RestoreParentTypeScope(ctx,source,parentType);
      ExpressionContext::PushTemporaryScope(ctx);
      argument._0_4_ = 0;
      pSStack_1d8 = (_pos->arguments).head;
      while (pSStack_1d8 != (SynFunctionArgument *)0x0) {
        expectedType._7_1_ = 0;
        actualArgument =
             (CallArgumentData *)
             AnalyzeType(ctx,pSStack_1d8->type,true,(bool *)((long)&expectedType + 7));
        if ((expectedType._7_1_ & 1) != 0) break;
        type = (TypeBase *)
               ArrayView<CallArgumentData>::operator[]
                         ((ArrayView<CallArgumentData> *)&ctx_local,(uint)argument);
        if ((TypeBase *)actualArgument == ctx->typeAuto) {
          local_308 = (TypeBase *)type->_vptr_TypeBase;
        }
        else {
          local_308 = MatchArgumentType(ctx,&pSStack_1d8->super_SynBase,(TypeBase *)actualArgument,
                                        (TypeBase *)type->_vptr_TypeBase,*(ExprBase **)&type->typeID
                                        ,aliases);
        }
        pTStack_1f8 = local_308;
        if ((local_308 == (TypeBase *)0x0) || (bVar1 = isType<TypeError>(local_308), bVar1)) break;
        this_00 = ExpressionContext::get<VariableData>(ctx);
        name = pSStack_1d8->name;
        uVar2 = ctx->uniqueVariableId;
        ctx->uniqueVariableId = uVar2 + 1;
        VariableData::VariableData
                  (this_00,ctx->allocator,&pSStack_1d8->super_SynBase,ctx->scope,0,pTStack_1f8,name,
                   0,uVar2);
        ExpressionContext::AddVariable(ctx,this_00,true);
        pTVar5 = ExpressionContext::get<TypeHandle>(ctx);
        TypeHandle::TypeHandle(pTVar5,pTStack_1f8);
        IntrusiveList<TypeHandle>::push_back((IntrusiveList<TypeHandle> *)local_e8,pTVar5);
        pSStack_1d8 = getType<SynFunctionArgument>((pSStack_1d8->super_SynBase).next);
        argument._0_4_ = (uint)argument + 1;
      }
      ExpressionContext::PopScope(ctx,SCOPE_TEMPORARY);
      if ((argument._7_1_ & 1) != 0) {
        ExpressionContext::PopScope(ctx,SCOPE_TYPE);
      }
    }
    ExpressionContext::SwitchToScopeAtPoint(ctx,(ScopeData *)types.tail,(SynBase *)0x0);
    memcpy(ctx->errorHandler,&traceDepth,200);
    ctx->errorHandlerNested = (bool)(syntax._7_1_ & 1);
    uVar2 = IntrusiveList<TypeHandle>::size((IntrusiveList<TypeHandle> *)local_e8);
    uVar3 = ArrayView<CallArgumentData>::size((ArrayView<CallArgumentData> *)&ctx_local);
    if (uVar2 == uVar3) {
      for (pMStack_270 = (function->generics).head; pMStack_270 != (MatchData *)0x0;
          pMStack_270 = pMStack_270->next) {
        alias._7_1_ = 0;
        for (local_280 = aliases->head; local_280 != (MatchData *)0x0; local_280 = local_280->next)
        {
          bVar1 = InplaceStr::operator==(&pMStack_270->name->name,&local_280->name->name);
          if (bVar1) {
            alias._7_1_ = 1;
            break;
          }
        }
        if ((alias._7_1_ & 1) == 0) {
          typeFunction = (TypeFunction *)aliases->head;
          local_2a0 = aliases->tail;
          GenericFunctionInstanceTypeResponse::GenericFunctionInstanceTypeResponse
                    (&local_298,(TypeFunction *)0x0,*aliases);
          SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
          ::insert(&ctx->genericFunctionInstanceTypeMap,
                   (GenericFunctionInstanceTypeRequest *)local_a8,&local_298);
          return (TypeFunction *)0x0;
        }
      }
      local_2c0 = (TypeHandle *)local_e8;
      local_2b8 = types.head;
      arguments_00.tail = types.head;
      arguments_00.head = (TypeHandle *)local_e8;
      local_2b0 = ExpressionContext::GetFunctionType
                            (ctx,source,function->type->returnType,arguments_00);
      GenericFunctionInstanceTypeResponse::GenericFunctionInstanceTypeResponse
                (&local_2d8,local_2b0,*aliases);
      SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
      ::insert(&ctx->genericFunctionInstanceTypeMap,(GenericFunctionInstanceTypeRequest *)local_a8,
               &local_2d8);
      arguments_local._8_8_ = local_2b0;
    }
    else {
      curr_1 = aliases->head;
      local_260 = aliases->tail;
      GenericFunctionInstanceTypeResponse::GenericFunctionInstanceTypeResponse
                (&local_258,(TypeFunction *)0x0,*aliases);
      SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
      ::insert(&ctx->genericFunctionInstanceTypeMap,(GenericFunctionInstanceTypeRequest *)local_a8,
               &local_258);
      arguments_local.count = 0;
      arguments_local._12_4_ = 0;
    }
  }
  else {
    aliases->head = (pGVar7->aliases).head;
    aliases->tail = (pGVar7->aliases).tail;
    arguments_local._8_8_ = pGVar7->functionType;
  }
  return (TypeFunction *)arguments_local._8_8_;
}

Assistant:

TypeFunction* GetGenericFunctionInstanceType(ExpressionContext &ctx, SynBase *source, TypeBase *parentType, FunctionData *function, ArrayView<CallArgumentData> arguments, IntrusiveList<MatchData> &aliases)
{
	assert(function->arguments.size() == arguments.size());

	// Lookup previous match for this function
	IntrusiveList<TypeHandle> incomingArguments;
	IntrusiveList<MatchData> incomingAliases;

	for(unsigned i = 0; i < arguments.size(); i++)
		incomingArguments.push_back(new (ctx.get<TypeHandle>()) TypeHandle(arguments[i].type));

	for(MatchData *curr = aliases.head; curr; curr = curr->next)
		incomingAliases.push_back(new (ctx.get<MatchData>()) MatchData(curr->name, curr->type));

	GenericFunctionInstanceTypeRequest request(parentType, function, incomingArguments, incomingAliases);

	if(GenericFunctionInstanceTypeResponse* response = ctx.genericFunctionInstanceTypeMap.find(request))
	{
		aliases = response->aliases;

		return response->functionType;
	}

	// Switch to original function scope
	ScopeData *scope = ctx.scope;

	ctx.SwitchToScopeAtPoint(function->scope, function->source);

	IntrusiveList<TypeHandle> types;

	jmp_buf prevErrorHandler;
	memcpy(&prevErrorHandler, &ctx.errorHandler, sizeof(jmp_buf));

	bool prevErrorHandlerNested = ctx.errorHandlerNested;
	ctx.errorHandlerNested = true;

	unsigned traceDepth = NULLC::TraceGetDepth();

	if(!setjmp(ctx.errorHandler))
	{
		if(SynFunctionDefinition *syntax = GetGenericFunctionDefinition(ctx, source, function))
		{
			bool addedParentScope = RestoreParentTypeScope(ctx, source, parentType);

			// Create temporary scope with known arguments for reference in type expression
			ctx.PushTemporaryScope();

			unsigned pos = 0;

			for(SynFunctionArgument *argument = syntax->arguments.head; argument; argument = getType<SynFunctionArgument>(argument->next), pos++)
			{
				bool failed = false;
				TypeBase *expectedType = AnalyzeType(ctx, argument->type, true, &failed);

				if(failed)
					break;

				CallArgumentData &actualArgument = arguments[pos];

				TypeBase *type = expectedType == ctx.typeAuto ? actualArgument.type : MatchArgumentType(ctx, argument, expectedType, actualArgument.type, actualArgument.value, aliases);

				if(!type || isType<TypeError>(type))
					break;

				ctx.AddVariable(new (ctx.get<VariableData>()) VariableData(ctx.allocator, argument, ctx.scope, 0, type, argument->name, 0, ctx.uniqueVariableId++), true);

				types.push_back(new (ctx.get<TypeHandle>()) TypeHandle(type));
			}

			ctx.PopScope(SCOPE_TEMPORARY);

			if(addedParentScope)
				ctx.PopScope(SCOPE_TYPE);
		}
		else
		{
			if(function->importModule)
				Stop(ctx, source, "ERROR: imported generic function call is not supported");

			for(unsigned i = 0; i < function->arguments.size(); i++)
			{
				ArgumentData &funtionArgument = function->arguments[i];

				CallArgumentData &actualArgument = arguments[i];

				TypeBase *type = MatchArgumentType(ctx, funtionArgument.source, funtionArgument.type, actualArgument.type, actualArgument.value, aliases);

				if(!type || isType<TypeError>(type))
				{
					ctx.genericFunctionInstanceTypeMap.insert(request, GenericFunctionInstanceTypeResponse(NULL, aliases));

					// TODO: what about scope restore
					return NULL;
				}

				types.push_back(new (ctx.get<TypeHandle>()) TypeHandle(type));
			}
		}
	}
	else
	{
		NULLC::TraceLeaveTo(traceDepth);

		// Restore old scope
		ctx.SwitchToScopeAtPoint(scope, NULL);

		memcpy(&ctx.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
		ctx.errorHandlerNested = prevErrorHandlerNested;

		longjmp(ctx.errorHandler, 1);
	}

	// Restore old scope
	ctx.SwitchToScopeAtPoint(scope, NULL);

	memcpy(&ctx.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
	ctx.errorHandlerNested = prevErrorHandlerNested;

	if(types.size() != arguments.size())
	{
		ctx.genericFunctionInstanceTypeMap.insert(request, GenericFunctionInstanceTypeResponse(NULL, aliases));

		return NULL;
	}

	// Check that all generics have been resolved
	for(MatchData *curr = function->generics.head; curr; curr = curr->next)
	{
		bool matched = false;

		for(MatchData *alias = aliases.head; alias; alias = alias->next)
		{
			if(curr->name->name == alias->name->name)
			{
				matched = true;
				break;
			}
		}

		if(!matched)
		{
			ctx.genericFunctionInstanceTypeMap.insert(request, GenericFunctionInstanceTypeResponse(NULL, aliases));

			return NULL;
		}
	}

	TypeFunction *typeFunction = ctx.GetFunctionType(source, function->type->returnType, types);

	ctx.genericFunctionInstanceTypeMap.insert(request, GenericFunctionInstanceTypeResponse(typeFunction, aliases));

	return typeFunction;
}